

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O0

ggml_float ggml_vec_soft_max_f32(int n,float *y,float *x,float max)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined1 auVar3 [64];
  float in_XMM0_Da;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float val_1;
  __m512 val;
  ggml_float sum;
  int i;
  undefined8 local_280;
  undefined8 uStackY_278;
  undefined8 uStackY_270;
  undefined8 uStackY_268;
  undefined8 uStackY_260;
  undefined8 uStackY_258;
  undefined8 uStackY_250;
  undefined8 uStackY_248;
  double local_230;
  int local_228;
  __m512 in_stack_ffffffffffffffb8;
  
  local_230 = 0.0;
  for (local_228 = 0; local_228 + 0xf < in_EDI; local_228 = local_228 + 0x10) {
    auVar3 = vbroadcastss_avx512f(ZEXT416((uint)in_XMM0_Da));
    auVar3 = vsubps_avx512f(*(undefined1 (*) [64])(in_RDX + (long)local_228 * 4),auVar3);
    ggml_v_expf(in_stack_ffffffffffffffb8);
    puVar1 = (undefined8 *)(in_RSI + (long)local_228 * 4);
    local_280 = auVar3._0_8_;
    uStackY_278 = auVar3._8_8_;
    uStackY_270 = auVar3._16_8_;
    uStackY_268 = auVar3._24_8_;
    uStackY_260 = auVar3._32_8_;
    uStackY_258 = auVar3._40_8_;
    uStackY_250 = auVar3._48_8_;
    uStackY_248 = auVar3._56_8_;
    *puVar1 = local_280;
    puVar1[1] = uStackY_278;
    puVar1[2] = uStackY_270;
    puVar1[3] = uStackY_268;
    puVar1[4] = uStackY_260;
    puVar1[5] = uStackY_258;
    puVar1[6] = uStackY_250;
    puVar1[7] = uStackY_248;
    auVar3 = vaddps_avx512f(auVar3,ZEXT3264(auVar3._32_32_));
    auVar5._0_4_ = auVar3._0_4_ + auVar3._16_4_;
    auVar5._4_4_ = auVar3._4_4_ + auVar3._20_4_;
    auVar5._8_4_ = auVar3._8_4_ + auVar3._24_4_;
    auVar5._12_4_ = auVar3._12_4_ + auVar3._28_4_;
    auVar2 = vpermilpd_avx(auVar5,1);
    auVar6._0_4_ = auVar5._0_4_ + auVar2._0_4_;
    auVar6._4_4_ = auVar5._4_4_ + auVar2._4_4_;
    auVar6._8_4_ = auVar5._8_4_ + auVar2._8_4_;
    auVar6._12_4_ = auVar5._12_4_ + auVar2._12_4_;
    auVar2 = vmovshdup_avx(auVar6);
    local_230 = (double)(auVar6._0_4_ + auVar2._0_4_ + -0.0) + local_230;
  }
  for (; local_228 < in_EDI; local_228 = local_228 + 1) {
    fVar4 = expf(*(float *)(in_RDX + (long)local_228 * 4) - in_XMM0_Da);
    local_230 = (double)fVar4 + local_230;
    *(float *)(in_RSI + (long)local_228 * 4) = fVar4;
  }
  return local_230;
}

Assistant:

ggml_float ggml_vec_soft_max_f32(const int n, float * y, const float * x, float max) {
    int i = 0;
    ggml_float sum = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        __m512 val = ggml_v_expf(_mm512_sub_ps(_mm512_loadu_ps(x + i),
                                               _mm512_set1_ps(max)));
        _mm512_storeu_ps(y + i, val);
        sum += (ggml_float)_mm512_reduce_add_ps(val);
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        __m256 val = ggml_v_expf(_mm256_sub_ps(_mm256_loadu_ps(x + i),
                                               _mm256_set1_ps(max)));
        _mm256_storeu_ps(y + i, val);
        __m128 val2 = _mm_add_ps(_mm256_extractf128_ps(val, 1),
                                 _mm256_castps256_ps128(val));
        val2 = _mm_add_ps(val2, _mm_movehl_ps(val2, val2));
        val2 = _mm_add_ss(val2, _mm_movehdup_ps(val2));
        sum += (ggml_float)_mm_cvtss_f32(val2);
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        __m128 val = ggml_v_expf(_mm_sub_ps(_mm_loadu_ps(x + i),
                                            _mm_set1_ps(max)));
        _mm_storeu_ps(y + i, val);
#if defined(__AVX__) || defined(__AVX2__) || defined(__AVX512F__)
        val = _mm_add_ps(val, _mm_movehl_ps(val, val));
        val = _mm_add_ss(val, _mm_movehdup_ps(val));
#else
        __m128 tmp = _mm_shuffle_ps(val, val, _MM_SHUFFLE(2, 3, 0, 1));
        val = _mm_add_ps(val, tmp);
        tmp = _mm_movehl_ps(tmp, val);
        val = _mm_add_ss(val, tmp);
#endif
        sum += (ggml_float)_mm_cvtss_f32(val);
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        float32x4_t val = ggml_v_expf(vsubq_f32(vld1q_f32(x + i),
                                                vdupq_n_f32(max)));
        vst1q_f32(y + i, val);
        sum += (ggml_float)vaddvq_f32(val);
    }
#endif
    for (; i < n; ++i) {
        float val = expf(x[i] - max);
        sum += (ggml_float)val;
        y[i] = val;
    }
    return sum;
}